

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

_Bool target_sighted(void)

{
  loc_conflict grid;
  _Bool _Var1;
  monster_conflict *mon;
  _Bool local_b;
  
  _Var1 = target_okay();
  if (!_Var1) {
    return false;
  }
  _Var1 = panel_contains(target.grid.y,target.grid.x);
  if (_Var1) {
    if ((target.midx == 0) &&
       (grid.y = target.grid.y, grid.x = target.grid.x, _Var1 = square_isseen((chunk *)cave,grid),
       _Var1)) {
      return true;
    }
    local_b = false;
    if (target.midx != 0) {
      mon = cave_monster(cave,target.midx);
      local_b = monster_is_visible((monster *)mon);
    }
    return local_b;
  }
  return false;
}

Assistant:

bool target_sighted(void)
{
	return target_okay() &&
			panel_contains(target.grid.y, target.grid.x) &&
			 /* either the target is a grid and is visible, or it is a monster
			  * that is visible */
		((!target.midx && square_isseen(cave, target.grid)) ||
		 (target.midx && monster_is_visible(cave_monster(cave, target.midx))));
}